

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_encoder.c
# Opt level: O3

void stream_encoder_end(void *coder_ptr,lzma_allocator *allocator)

{
  long lVar1;
  long *plVar2;
  
  lzma_next_end((lzma_next_coder *)((long)coder_ptr + 8),allocator);
  lzma_next_end((lzma_next_coder *)((long)coder_ptr + 0x170),allocator);
  lzma_index_end(*(lzma_index **)((long)coder_ptr + 0x1b8),allocator);
  if (*(long *)((long)coder_ptr + 0x120) != -1) {
    plVar2 = (long *)((long)coder_ptr + 0x130);
    do {
      lzma_free((void *)plVar2[-1],allocator);
      lVar1 = *plVar2;
      plVar2 = plVar2 + 2;
    } while (lVar1 != -1);
  }
  lzma_free(coder_ptr,allocator);
  return;
}

Assistant:

static void
stream_encoder_end(void *coder_ptr, const lzma_allocator *allocator)
{
	lzma_stream_coder *coder = coder_ptr;

	lzma_next_end(&coder->block_encoder, allocator);
	lzma_next_end(&coder->index_encoder, allocator);
	lzma_index_end(coder->index, allocator);

	for (size_t i = 0; coder->filters[i].id != LZMA_VLI_UNKNOWN; ++i)
		lzma_free(coder->filters[i].options, allocator);

	lzma_free(coder, allocator);
	return;
}